

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall ViewTest::asStringTest<true>(ViewTest *this)

{
  View<int,_true,_std::allocator<unsigned_long>_> w;
  size_t shape [3];
  View<int,_true,_std::allocator<unsigned_long>_> v;
  stringstream s;
  string local_270;
  StringStyle local_24c;
  undefined1 local_248 [8];
  size_type local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  size_t local_220;
  unsigned_long local_208 [4];
  undefined1 local_1e8 [16];
  size_t *local_1d8;
  size_t local_1c0;
  allocator_type local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  local_208[0] = 3;
  local_208[1] = 2;
  local_208[2] = 4;
  local_1e8._0_8_ = this->data_;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long*>
            ((Geometry<std::allocator<unsigned_long>> *)(local_1e8 + 8),local_208,local_208 + 3,
             &andres::defaultOrder,&andres::defaultOrder,local_1a8);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1e8);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  local_270._M_dataplus._M_p._0_4_ = 1;
  andres::View<int,true,std::allocator<unsigned_long>>::asString_abi_cxx11_
            ((string *)local_248,(View<int,true,std::allocator<unsigned_long>> *)local_1e8,
             (StringStyle *)&local_270);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,(char *)local_248,local_240);
  if (local_248 != (undefined1  [8])&local_238) {
    operator_delete((void *)local_248,local_238._M_allocated_capacity + 1);
  }
  local_270._M_dataplus._M_p._0_4_ = 0;
  andres::View<int,true,std::allocator<unsigned_long>>::asString_abi_cxx11_
            ((string *)local_248,(View<int,true,std::allocator<unsigned_long>> *)local_1e8,
             (StringStyle *)&local_270);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,(char *)local_248,local_240);
  if (local_248 != (undefined1  [8])&local_238) {
    operator_delete((void *)local_248,local_238._M_allocated_capacity + 1);
  }
  local_248 = (undefined1  [8])this->data_;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::Geometry<unsigned_long*>
            ((Geometry<std::allocator<unsigned_long>> *)&local_240,local_208,local_208 + 3,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)&local_270);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_248);
  local_24c = MatrixStyle;
  andres::View<int,true,std::allocator<unsigned_long>>::asString_abi_cxx11_
            (&local_270,(View<int,true,std::allocator<unsigned_long>> *)local_248,&local_24c);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,
             (char *)CONCAT44(local_270._M_dataplus._M_p._4_4_,local_270._M_dataplus._M_p._0_4_),
             local_270._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_270._M_dataplus._M_p._4_4_,local_270._M_dataplus._M_p._0_4_) !=
      &local_270.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_270._M_dataplus._M_p._4_4_,local_270._M_dataplus._M_p._0_4_),
                    local_270.field_2._M_allocated_capacity + 1);
  }
  local_24c = TableStyle;
  andres::View<int,true,std::allocator<unsigned_long>>::asString_abi_cxx11_
            (&local_270,(View<int,true,std::allocator<unsigned_long>> *)local_248,&local_24c);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,
             (char *)CONCAT44(local_270._M_dataplus._M_p._4_4_,local_270._M_dataplus._M_p._0_4_),
             local_270._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_270._M_dataplus._M_p._4_4_,local_270._M_dataplus._M_p._0_4_) !=
      &local_270.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_270._M_dataplus._M_p._4_4_,local_270._M_dataplus._M_p._0_4_),
                    local_270.field_2._M_allocated_capacity + 1);
  }
  operator_delete((void *)local_238._M_allocated_capacity,local_220 * 0x18);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  std::ios_base::~ios_base(local_128);
  operator_delete(local_1d8,local_1c0 * 0x18);
  return;
}

Assistant:

void ViewTest::asStringTest()
{
    {
        std::size_t shape[3] = {3, 2, 4};

        andres::View<int, constTarget> v(&shape[0], &shape[3], data_);
        std::stringstream s;
        s << v.asString(andres::MatrixStyle);
        s << v.asString(andres::TableStyle);

        const andres::View<int, constTarget> w(&shape[0], &shape[3], data_);
        s << w.asString(andres::MatrixStyle);
        s << w.asString(andres::TableStyle);
    }
}